

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

void __thiscall AGSSock::AGSSocket::Unserialize(AGSSocket *this,int key,char *buffer,int length)

{
  undefined4 *puVar1;
  undefined8 uVar2;
  ulong uVar3;
  size_t __n;
  string tag;
  AGSSocketSerial serial;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 local_54;
  long *local_50 [2];
  long local_40 [2];
  
  uVar3 = (ulong)length;
  __n = 0x18;
  if (uVar3 < 0x18) {
    __n = uVar3;
  }
  memcpy(&local_68,buffer,__n);
  local_80 = 0;
  local_78 = 0;
  local_88 = &local_78;
  if ((int)__n < length) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,buffer + __n,buffer + uVar3);
    std::__cxx11::string::operator=((string *)&local_88,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  puVar1 = (undefined4 *)operator_new(0xa0);
  *puVar1 = 0xffffffff;
  puVar1[1] = local_68;
  puVar1[2] = uStack_64;
  puVar1[3] = uStack_60;
  puVar1[4] = uStack_5c;
  uVar2 = (**(code **)(*AGSSockAPI::engine + 0x238))(AGSSockAPI::engine,local_58);
  *(undefined8 *)(puVar1 + 6) = uVar2;
  uVar2 = (**(code **)(*AGSSockAPI::engine + 0x238))(AGSSockAPI::engine,local_54);
  *(undefined8 *)(puVar1 + 8) = uVar2;
  *(undefined4 **)(puVar1 + 10) = puVar1 + 0xe;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 10),local_88,local_88 + local_80);
  *(undefined8 *)(puVar1 + 0x22) = 0;
  *(undefined8 *)(puVar1 + 0x24) = 0;
  *(undefined8 *)(puVar1 + 0x1e) = 0;
  *(undefined8 *)(puVar1 + 0x20) = 0;
  *(undefined8 *)(puVar1 + 0x1a) = 0;
  *(undefined8 *)(puVar1 + 0x1c) = 0;
  *(undefined8 *)(puVar1 + 0x16) = 0;
  *(undefined8 *)(puVar1 + 0x18) = 0;
  *(undefined8 *)(puVar1 + 0x12) = 0;
  *(undefined8 *)(puVar1 + 0x14) = 0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(puVar1 + 0x12),0);
  puVar1[0x26] = 0;
  (**(code **)(*AGSSockAPI::engine + 0x230))(AGSSockAPI::engine,key,puVar1,&agsSocket);
  if (local_88 != &local_78) {
    operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
  }
  return;
}

Assistant:

void AGSSocket::Unserialize(int key, const char *buffer, int length)
{
	AGSSocketSerial serial;
	int size = MIN(length, sizeof (AGSSocketSerial));
	memcpy(&serial, buffer, size);

	string tag;
	if (length - size > 0)
		tag = string(buffer + size, (size_t) length - size);
	
	Socket *sock = new Socket
	{
		INVALID_SOCKET,
		serial.domain, serial.type, serial.protocol,
		serial.error,
		AGS_FROM_KEY(SockAddr, serial.local),
		AGS_FROM_KEY(SockAddr, serial.remote),
		tag
	};
	
	AGS_RESTORE(Socket, sock, key);
}